

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

OptionalStorage<llvm::DWARFDebugRnglistTable,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
          (OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this,DWARFDebugRnglistTable *y)

{
  if (this->hasVal == true) {
    DWARFListTableBase<llvm::DWARFDebugRnglist>::operator=
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)this,
               &y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>);
  }
  else {
    DWARFListTableBase<llvm::DWARFDebugRnglist>::DWARFListTableBase
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)this,
               &y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T const &y) {
    if (hasValue()) {
      value = y;
    } else {
      ::new ((void *)std::addressof(value)) T(y);
      hasVal = true;
    }
    return *this;
  }